

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::testGroupEnded(ConsoleReporter *this,TestGroupStats *_testGroupStats)

{
  GroupInfo *pGVar1;
  pointer pcVar2;
  ostream *poVar3;
  
  if ((this->super_StreamingReporterBase).unusedGroupInfo.nullableValue == (GroupInfo *)0x0) {
    printSummaryDivider(this);
    poVar3 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Summary for group \'",0x13);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(_testGroupStats->groupInfo).name._M_dataplus._M_p,
                        (_testGroupStats->groupInfo).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\':\n",3);
    printTotals(this,&_testGroupStats->totals);
    poVar3 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  pGVar1 = (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue;
  if ((pGVar1 != (GroupInfo *)0x0) &&
     (pcVar2 = (pGVar1->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pGVar1->name).field_2)) {
    operator_delete(pcVar2);
  }
  (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue = (GroupInfo *)0x0;
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& _testGroupStats ) {
            if( !unusedGroupInfo ) {
                printSummaryDivider();
                stream << "Summary for group '" << _testGroupStats.groupInfo.name << "':\n";
                printTotals( _testGroupStats.totals );
                stream << "\n" << std::endl;
            }
            StreamingReporterBase::testGroupEnded( _testGroupStats );
        }